

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseKernel.hh
# Opt level: O1

void __thiscall
OpenMesh::BaseKernel::copy_all_properties
          (BaseKernel *this,FaceHandle _fh_from,FaceHandle _fh_to,bool _copyBuildIn)

{
  int iVar1;
  pointer ppBVar2;
  bool bVar3;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  long local_40;
  long local_38;
  
  ppBVar2 = (this->fprops_).properties_.
            super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppBVar2 !=
      (this->fprops_).properties_.
      super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_40 = (long)(int)_fh_from.super_BaseHandle.idx_;
    local_38 = (long)(int)_fh_to.super_BaseHandle.idx_;
    do {
      bVar3 = *ppBVar2 != (BaseProperty *)0x0;
      if (bVar3 && !_copyBuildIn) {
        std::__cxx11::string::substr((ulong)local_60,(ulong)&(*ppBVar2)->name_);
        iVar1 = std::__cxx11::string::compare((char *)local_60);
        bVar3 = iVar1 != 0;
        if (local_60[0] != local_50) {
          operator_delete(local_60[0]);
        }
      }
      if (bVar3) {
        (*(*ppBVar2)->_vptr_BaseProperty[7])(*ppBVar2,local_40,local_38);
      }
      ppBVar2 = ppBVar2 + 1;
    } while (ppBVar2 !=
             (this->fprops_).properties_.
             super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void copy_all_properties(FaceHandle _fh_from, FaceHandle _fh_to, bool _copyBuildIn = false) {

    for( PropertyContainer::iterator p_it = fprops_.begin();
        p_it != fprops_.end(); ++p_it) {

      // Copy all properties, if build in is true
      // Otherwise, copy only properties without build in specifier
      if ( *p_it && ( _copyBuildIn || (*p_it)->name().substr(0,2) != "f:") )
        (*p_it)->copy(_fh_from.idx(), _fh_to.idx());
    }

  }